

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O3

int main(void)

{
  timer func;
  long lVar1;
  uint uVar2;
  long *plVar3;
  canceler func_00;
  undefined1 auVar4 [12];
  io_service srv;
  sock1 s1;
  native_type fds [2];
  sock2 s2;
  ptime local_70;
  undefined1 local_60 [8];
  ptime *ppStack_58;
  int local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  uint local_40;
  native_type local_3c;
  sock2 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing IO events",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  booster::aio::io_service::io_service((io_service *)&local_70);
  pair((native_type *)&local_40);
  local_60._0_4_ = local_40;
  local_50 = 0;
  local_38.fd = local_3c;
  local_38.counter = 0;
  ppStack_58 = &local_70;
  local_38.srv = (io_service *)&local_70;
  sock1::async_run((sock1 *)local_60);
  sock2::async_run(&local_38);
  booster::aio::io_service::run();
  if (done == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"done",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,199);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  booster::aio::io_service::reset();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing timer events",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_60 = (undefined1  [8])&local_70;
  auVar4 = booster::ptime::now();
  local_38._0_8_ = 0;
  local_38.srv._0_4_ = 100000000;
  booster::ptime::normalize((ptime *)&local_38);
  local_38._0_8_ = auVar4._0_8_ + local_38._0_8_;
  local_38.srv = (io_service *)CONCAT44(local_38.srv._4_4_,auVar4._8_4_ + (int)local_38.srv);
  booster::ptime::normalize((ptime *)&local_38);
  ppStack_58 = (ptime *)local_38._0_8_;
  local_50 = (int)local_38.srv;
  uStack_48 = 0;
  uStack_44 = uStack_44 & 0xffffff00;
  func.t._12_4_ = uStack_4c;
  func.t.nsec = (int)local_38.srv;
  lVar1 = (ulong)uStack_44 << 0x20;
  func.t.sec = local_38._0_8_;
  func.srv = (io_service *)local_60;
  func.event_id = (int)lVar1;
  func.cancel = (bool)(char)((ulong)lVar1 >> 0x20);
  func._29_3_ = (int3)((ulong)lVar1 >> 0x28);
  booster::callback<void_(const_std::error_code_&)>::callback<timer>
            ((callback<void_(const_std::error_code_&)> *)&local_38,func);
  booster::aio::io_service::set_timer_event(&local_70,(callback *)&ppStack_58);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_38);
  booster::aio::io_service::run();
  if (timer_done == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"timer_done",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  booster::aio::io_service::reset();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing IO events cancelation",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  pair((native_type *)&local_40);
  uVar2 = local_40;
  booster::callback<void_(const_std::error_code_&)>::callback<cancel_handler>
            ((callback<void_(const_std::error_code_&)> *)local_60,(io_service *)&local_70);
  booster::aio::io_service::set_io_event((int)&local_70,uVar2,(callback *)0x1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_60);
  auVar4 = booster::ptime::now();
  local_60 = (undefined1  [8])0x0;
  ppStack_58._0_4_ = 100000000;
  booster::ptime::normalize((ptime *)local_60);
  local_60 = (undefined1  [8])(auVar4._0_8_ + (long)local_60);
  ppStack_58 = (ptime *)CONCAT44(ppStack_58._4_4_,auVar4._8_4_ + (int)ppStack_58);
  booster::ptime::normalize((ptime *)local_60);
  local_38._0_8_ = local_60;
  local_38.srv = (io_service *)CONCAT44(local_38.srv._4_4_,(int)ppStack_58);
  func_00._4_4_ = 0;
  func_00.fd = local_40;
  func_00.srv = (io_service *)&local_70;
  booster::callback<void_(const_std::error_code_&)>::callback<canceler>
            ((callback<void_(const_std::error_code_&)> *)local_60,func_00);
  booster::aio::io_service::set_timer_event(&local_70,(callback *)&local_38);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_60);
  booster::aio::io_service::run();
  if (cancel_called != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cancel_called==1",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xdb);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing post()",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (post_executed == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"post_executed",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xdd);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  the_service = (io_service *)&local_70;
  booster::aio::io_service::reset();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing adding invalid socket id",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            ((callback<void(std::error_code_const&)> *)local_60,got_error);
  booster::aio::io_service::set_io_event((int)&local_70,-1,(callback *)0x1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_60);
  got_error_called = false;
  booster::aio::io_service::run();
  if (got_error_called == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"got_error_called",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  booster::aio::io_service::reset();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing event from other thread",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  post_executed = false;
  std::thread::thread<void(&)(),,void>((thread *)local_60,poster);
  booster::aio::io_service::run();
  std::thread::join();
  if (post_executed == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"post_executed",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0xef);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return_code = 1;
  }
  if (local_60 == (undefined1  [8])0x0) {
    booster::aio::io_service::~io_service((io_service *)&local_70);
    if (return_code == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    return return_code;
  }
  std::terminate();
}

Assistant:

int main()
{
	try {
		std::cout << "Testing IO events" << std::endl;
		booster::aio::io_service srv;
		{
			booster::aio::native_type fds[2];
			pair(fds);
			sock1 s1(fds[0],&srv);
			sock2 s2(fds[1],&srv);
			s1.async_run();
			s2.async_run();
			srv.run();
			TEST(done);
		}
		srv.reset();
		{
			std::cout << "Testing timer events" << std::endl;
			timer tt = { &srv, booster::ptime::now() + ptime::milliseconds(100), 0, false };
			srv.set_timer_event(tt.t,tt);
			srv.run();
			TEST(timer_done);
		}
		srv.reset();
		{
			std::cout << "Testing IO events cancelation" << std::endl;
			booster::aio::native_type fds[2];
			pair(fds);
			cancel_handler ch = { &srv };
			srv.set_io_event(fds[0],booster::aio::io_service::in,ch);
			canceler c = { fds[0], &srv };
			srv.set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
			srv.run();
			TEST(cancel_called==1);
			std::cout << "Testing post()" << std::endl;
			TEST(post_executed);
		}
		the_service = &srv;
		srv.reset();
		{
			std::cout << "Testing adding invalid socket id" << std::endl;
			srv.set_io_event(booster::aio::invalid_socket,booster::aio::io_service::in,got_error);
			got_error_called = false;
			srv.run();
			TEST(got_error_called);
		}
		srv.reset();
		{
			std::cout << "Testing event from other thread" << std::endl;
			post_executed = false;
			booster::thread p(poster);
			srv.run();
			p.join();
			TEST(post_executed);
		}
	}
	catch(std::exception const &e)
	{
		std::cout<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" << std::endl;
	return return_code;
}